

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::BindSparseResourceMemory
          (DeviceContextVkImpl *this,BindSparseResourceMemoryAttribs *Attribs)

{
  allocator<VkSparseBufferMemoryBindInfo> *this_00;
  allocator<VkSparseImageOpaqueMemoryBindInfo> *this_01;
  allocator<VkSparseImageMemoryBindInfo> *this_02;
  allocator<VkSparseMemoryBind> *this_03;
  VkDeviceSize VVar1;
  long lVar2;
  undefined *puVar3;
  FenceVkImpl *this_04;
  bool bVar4;
  SPARSE_TEXTURE_FLAGS SVar5;
  VkImageAspectFlags VVar6;
  Uint32 UVar7;
  uint uVar8;
  Char *pCVar9;
  undefined8 *puVar10;
  TextureVkImpl *pTVar11;
  SparseTextureProperties *pSVar12;
  reference pvVar13;
  VkBuffer pVVar14;
  reference pvVar15;
  size_t *psVar16;
  IDeviceMemoryVk *pIVar17;
  TextureDesc *this_05;
  TextureFormatAttribs *pTVar18;
  uint *puVar19;
  uint *puVar20;
  reference pvVar21;
  VkImage pVVar22;
  reference pvVar23;
  reference pvVar24;
  char (*Args_1) [40];
  char (*Args_1_00) [50];
  char (*Args_1_01) [38];
  char (*Args_1_02) [64];
  size_type sVar25;
  reference ppVVar26;
  FenceDesc *Args;
  char (*Args_4) [54];
  undefined8 uVar27;
  ICommandQueueType *Ptr;
  char (*in_RCX) [60];
  ulong uVar28;
  SparseBufferProperties SVar29;
  char (*in_stack_fffffffffffff7f8) [2];
  Uint64 UVar30;
  unsigned_long *local_7c8;
  unsigned_long *local_7c0;
  VkSemaphore_T **local_7b8;
  VkSemaphore_T **local_7a8;
  VkSparseImageMemoryBindInfo *local_720;
  VkSparseImageOpaqueMemoryBindInfo *local_710;
  VkSparseBufferMemoryBindInfo *local_700;
  shared_ptr<Diligent::SyncPointVk> local_5b8;
  SoftwareQueueIndex local_5a1;
  FenceVkImpl *local_5a0;
  FenceVkImpl *pFenceVk_2;
  undefined1 local_590 [4];
  Uint32 i_6;
  element_type *local_580;
  CommandQueueVkImpl *pQueueVk;
  SyncPointVkPtr pSyncPoint;
  VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo;
  unsigned_long local_530;
  pointer local_528;
  value_type local_51c;
  NativeType local_518;
  uchar local_509;
  undefined1 local_508 [8];
  VulkanRecycledSemaphore WaitSem_1;
  string _msg;
  size_t j_1;
  VkSemaphore WaitSem;
  Uint64 WaitValue;
  FenceVkImpl *pFenceVk_1;
  VkSemaphore pVStack_4a0;
  Uint32 i_5;
  Char *local_498;
  Uint64 SignalValue;
  FenceVkImpl *pFenceVk;
  Uint32 i_4;
  bool UsedTimelineSemaphore;
  string msg_13;
  string msg_12;
  size_type local_438;
  __buckets_ptr local_430;
  undefined1 auStack_428 [8];
  VkBindSparseInfo BindSparse;
  undefined1 local_3c0 [8];
  string msg_11;
  string msg_10;
  string msg_9;
  string msg_8;
  VkSparseImageMemoryBindInfo *vkImgBind;
  string msg_7;
  string msg_6;
  VkSparseMemoryBind *vkMemBind_1;
  VkSparseImageOpaqueMemoryBindInfo *vkImgOpqBind;
  uint local_2e0;
  Uint32 local_2dc;
  uint local_2d8;
  Uint32 local_2d4;
  reference local_2d0;
  VkSparseImageMemoryBind *vkImgMemBind;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  Uint32 TexDepth;
  uint local_2b0;
  uint local_2ac;
  Uint32 TexHeight;
  uint local_2a4;
  undefined1 local_2a0 [4];
  Uint32 TexWidth;
  string msg_5;
  DeviceMemoryRangeVk MemRangeVk_1;
  string msg_4;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> pMemVk_1;
  SparseTextureMemoryBindRange *SrcRange_1;
  uint local_230;
  Uint32 r_1;
  Uint32 NumImageBindsInRange_1;
  VkImageAspectFlags aspectMask;
  TextureFormatAttribs *FmtAttribs;
  SparseTextureProperties *TexSparseProps_1;
  TextureDesc *TexDesc;
  TextureVkImpl *pTexVk_1;
  SparseTextureMemoryBindInfo *TexBind;
  undefined1 local_1f8 [4];
  Uint32 i_3;
  string msg_3;
  VkSparseMemoryBind *vkMemBind;
  string msg_2;
  DeviceMemoryRangeVk MemRangeVk;
  string msg_1;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> pMemVk;
  SparseBufferMemoryBindRange *SrcRange;
  Uint32 r;
  VkSparseBufferMemoryBindInfo *vkBuffBind;
  Uint64 local_148;
  Uint32 local_140;
  Uint64 *local_138;
  SparseBufferProperties *BuffSparseProps;
  BufferVkImpl *pBuffVk;
  SparseBufferMemoryBindInfo *BuffBind;
  Uint32 i_2;
  vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> vkImageMemoryBinds;
  undefined1 local_f8 [8];
  vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> vkMemoryBinds;
  undefined1 local_d8 [8];
  vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> vkImageBinds;
  undefined1 local_b8 [8];
  vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  vkImageOpaqueBinds;
  undefined1 local_98 [8];
  vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> vkBufferBinds;
  Uint32 j;
  Uint32 NumImageBindsInRange;
  SparseTextureProperties *TexSparseProps;
  TextureVkImpl *pTexVk;
  SparseTextureMemoryBindInfo *Bind;
  uint local_58;
  Uint32 i_1;
  Uint32 i;
  Uint32 ImageMemoryBindCount;
  Uint32 MemoryBindCount;
  Uint32 ImageOpqBindCount;
  Uint32 ImageBindCount;
  undefined1 local_38 [8];
  string msg;
  BindSparseResourceMemoryAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = Attribs;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  if ((*(int *)(msg.field_2._8_8_ + 8) == 0) && (*(int *)(msg.field_2._8_8_ + 0x18) == 0)) {
    FormatString<char[26],char[60]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0",in_RCX);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xfc7);
    std::__cxx11::string::~string((string *)local_38);
  }
  Flush(this);
  MemoryBindCount = 0;
  ImageMemoryBindCount = 0;
  i = 0;
  i_1 = 0;
  for (local_58 = 0; local_58 < *(uint *)(msg.field_2._8_8_ + 8); local_58 = local_58 + 1) {
    i = *(int *)(*(long *)msg.field_2._8_8_ + (ulong)local_58 * 0x18 + 0x10) + i;
  }
  for (Bind._4_4_ = 0; Bind._4_4_ < *(uint *)(msg.field_2._8_8_ + 0x18); Bind._4_4_ = Bind._4_4_ + 1
      ) {
    puVar10 = (undefined8 *)(*(long *)(msg.field_2._8_8_ + 0x10) + (ulong)Bind._4_4_ * 0x18);
    pTVar11 = ClassPtrCast<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)*puVar10);
    pSVar12 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties
                        (&pTVar11->super_TextureBase<Diligent::EngineVkImplTraits>);
    vkBufferBinds.
    super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    for (vkBufferBinds.
         super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)vkBufferBinds.
              super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < *(uint *)(puVar10 + 2);
        vkBufferBinds.
        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)vkBufferBinds.
                   super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      if (*(uint *)(puVar10[1] +
                   (ulong)(uint)vkBufferBinds.
                                super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x40) <
          pSVar12->FirstMipInTail) {
        vkBufferBinds.
        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             vkBufferBinds.
             super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        i_1 = i_1 + 1;
      }
      else {
        i = i + 1;
        ImageMemoryBindCount = ImageMemoryBindCount + 1;
      }
    }
    if (vkBufferBinds.
        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      MemoryBindCount = MemoryBindCount + 1;
    }
  }
  uVar8 = *(uint *)(msg.field_2._8_8_ + 8);
  this_00 = (allocator<VkSparseBufferMemoryBindInfo> *)
            ((long)&vkImageOpaqueBinds.
                    super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<VkSparseBufferMemoryBindInfo>::allocator(this_00);
  std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::vector
            ((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> *)
             local_98,(ulong)uVar8,this_00);
  std::allocator<VkSparseBufferMemoryBindInfo>::~allocator
            ((allocator<VkSparseBufferMemoryBindInfo> *)
             ((long)&vkImageOpaqueBinds.
                     super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_01 = (allocator<VkSparseImageOpaqueMemoryBindInfo> *)
            ((long)&vkImageBinds.
                    super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<VkSparseImageOpaqueMemoryBindInfo>::allocator(this_01);
  std::vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::vector((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            *)local_b8,(ulong)ImageMemoryBindCount,this_01);
  std::allocator<VkSparseImageOpaqueMemoryBindInfo>::~allocator
            ((allocator<VkSparseImageOpaqueMemoryBindInfo> *)
             ((long)&vkImageBinds.
                     super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_02 = (allocator<VkSparseImageMemoryBindInfo> *)
            ((long)&vkMemoryBinds.
                    super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<VkSparseImageMemoryBindInfo>::allocator(this_02);
  std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::vector
            ((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> *)
             local_d8,(ulong)MemoryBindCount,this_02);
  std::allocator<VkSparseImageMemoryBindInfo>::~allocator
            ((allocator<VkSparseImageMemoryBindInfo> *)
             ((long)&vkMemoryBinds.
                     super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_03 = (allocator<VkSparseMemoryBind> *)
            ((long)&vkImageMemoryBinds.
                    super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<VkSparseMemoryBind>::allocator(this_03);
  std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::vector
            ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)local_f8,(ulong)i,
             this_03);
  std::allocator<VkSparseMemoryBind>::~allocator
            ((allocator<VkSparseMemoryBind> *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<VkSparseImageMemoryBind>::allocator
            ((allocator<VkSparseImageMemoryBind> *)((long)&BuffBind + 7));
  std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::vector
            ((vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> *)&i_2,
             (ulong)i_1,(allocator<VkSparseImageMemoryBind> *)((long)&BuffBind + 7));
  std::allocator<VkSparseImageMemoryBind>::~allocator
            ((allocator<VkSparseImageMemoryBind> *)((long)&BuffBind + 7));
  i = 0;
  i_1 = 0;
  MemoryBindCount = 0;
  ImageMemoryBindCount = 0;
  for (BuffBind._0_4_ = 0; (uint)BuffBind < *(uint *)(msg.field_2._8_8_ + 8);
      BuffBind._0_4_ = (uint)BuffBind + 1) {
    pBuffVk = (BufferVkImpl *)(*(long *)msg.field_2._8_8_ + (ulong)(uint)BuffBind * 0x18);
    BuffSparseProps =
         (SparseBufferProperties *)
         ClassPtrCast<Diligent::BufferVkImpl_const,Diligent::IBuffer>
                   ((IBuffer *)
                    (pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .super_ObjectBase<Diligent::IBufferVk>.
                    super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.super_IBuffer.
                    super_IDeviceObject);
    SVar29 = BufferVkImpl::GetSparseProperties((BufferVkImpl *)BuffSparseProps);
    local_148 = SVar29.AddressSpaceSize;
    local_140 = SVar29.BlockSize;
    local_138 = &local_148;
    pvVar13 = std::
              vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::
              operator[]((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                          *)local_98,(ulong)(uint)BuffBind);
    pVVar14 = BufferVkImpl::GetVkBuffer((BufferVkImpl *)BuffSparseProps);
    pvVar13->buffer = pVVar14;
    pvVar13->bindCount =
         *(uint32_t *)
          &(pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_pDevice;
    pvVar15 = std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::operator[]
                        ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)local_f8
                         ,(ulong)i);
    pvVar13->pBinds = pvVar15;
    for (SrcRange._4_4_ = 0;
        SrcRange._4_4_ <
        *(uint *)&(pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_pDevice; SrcRange._4_4_ = SrcRange._4_4_ + 1) {
      psVar16 = ((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 .super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.
                m_pRefCounters)->m_ObjectWrapperBuffer + (ulong)SrcRange._4_4_ * 4 + -1;
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_1.field_2 + 8),
                 *(IObject **)(psVar16 + 3),(INTERFACE_ID *)IID_DeviceMemoryVk);
      VVar1 = *(VkDeviceSize *)(psVar16 + 3);
      pIVar17 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceMemoryVk_
                          ((RefCntAutoPtr *)(msg_1.field_2._M_local_buf + 8));
      if ((VVar1 != 0) != (pIVar17 != (IDeviceMemoryVk *)0x0)) {
        FormatString<char[70]>
                  ((string *)&MemRangeVk.Size,
                   (char (*) [70])
                   "Failed to query IDeviceMemoryVk interface from non-null memory object");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1009);
        std::__cxx11::string::~string((string *)&MemRangeVk.Size);
      }
      bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                        ((RefCntAutoPtr *)(msg_1.field_2._M_local_buf + 8));
      if (bVar4) {
        pIVar17 = RefCntAutoPtr<Diligent::IDeviceMemoryVk>::operator->
                            ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_1.field_2 + 8))
        ;
        (*(pIVar17->super_IDeviceMemory).super_IDeviceObject.super_IObject._vptr_IObject[0xb])
                  ((undefined1 *)((long)&msg_2.field_2 + 8),pIVar17,psVar16[1],psVar16[2]);
      }
      else {
        msg_2.field_2._8_8_ = 0;
        MemRangeVk.Handle = (VkDeviceMemory)0x0;
        MemRangeVk.Offset = 0;
      }
      if ((ulong)MemRangeVk.Handle % (ulong)(uint)local_138[1] != 0) {
        FormatString<char[71]>
                  ((string *)&vkMemBind,
                   (char (*) [71])
                   "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x100d);
        std::__cxx11::string::~string((string *)&vkMemBind);
      }
      msg_3.field_2._8_8_ =
           std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::operator[]
                     ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)local_f8,
                      (ulong)i);
      ((reference)msg_3.field_2._8_8_)->resourceOffset = *psVar16;
      ((reference)msg_3.field_2._8_8_)->size = psVar16[2];
      ((reference)msg_3.field_2._8_8_)->memory = (VkDeviceMemory)msg_2.field_2._8_8_;
      ((reference)msg_3.field_2._8_8_)->memoryOffset = (VkDeviceSize)MemRangeVk.Handle;
      ((reference)msg_3.field_2._8_8_)->flags = 0;
      if (((reference)msg_3.field_2._8_8_)->size == 0) {
        FormatString<char[36]>
                  ((string *)local_1f8,(char (*) [36])"Buffer memory size must not be zero");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1016);
        std::__cxx11::string::~string((string *)local_1f8);
      }
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_1.field_2 + 8));
      i = i + 1;
    }
  }
  for (TexBind._4_4_ = 0; TexBind._4_4_ < *(uint *)(msg.field_2._8_8_ + 0x18);
      TexBind._4_4_ = TexBind._4_4_ + 1) {
    puVar10 = (undefined8 *)(*(long *)(msg.field_2._8_8_ + 0x10) + (ulong)TexBind._4_4_ * 0x18);
    pTVar11 = ClassPtrCast<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)*puVar10);
    this_05 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         *)pTVar11);
    pSVar12 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties
                        (&pTVar11->super_TextureBase<Diligent::EngineVkImplTraits>);
    pTVar18 = GetTextureFormatAttribs(this_05->Format);
    VVar6 = ComponentTypeToVkAspectMask(pTVar18->ComponentType);
    local_230 = 0;
    for (SrcRange_1._4_4_ = 0; SrcRange_1._4_4_ < *(uint *)(puVar10 + 2);
        SrcRange_1._4_4_ = SrcRange_1._4_4_ + 1) {
      puVar19 = (uint *)(puVar10[1] + (ulong)SrcRange_1._4_4_ * 0x40);
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_4.field_2 + 8),
                 *(IObject **)(puVar19 + 0xe),(INTERFACE_ID *)IID_DeviceMemoryVk);
      lVar2 = *(long *)(puVar19 + 0xe);
      pIVar17 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceMemoryVk_
                          ((RefCntAutoPtr *)(msg_4.field_2._M_local_buf + 8));
      if ((lVar2 != 0) != (pIVar17 != (IDeviceMemoryVk *)0x0)) {
        FormatString<char[70]>
                  ((string *)&MemRangeVk_1.Size,
                   (char (*) [70])
                   "Failed to query IDeviceMemoryVk interface from non-null memory object");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1029);
        std::__cxx11::string::~string((string *)&MemRangeVk_1.Size);
      }
      bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                        ((RefCntAutoPtr *)(msg_4.field_2._M_local_buf + 8));
      if (bVar4) {
        pIVar17 = RefCntAutoPtr<Diligent::IDeviceMemoryVk>::operator->
                            ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_4.field_2 + 8))
        ;
        (*(pIVar17->super_IDeviceMemory).super_IDeviceObject.super_IObject._vptr_IObject[0xb])
                  ((undefined1 *)((long)&msg_5.field_2 + 8),pIVar17,*(undefined8 *)(puVar19 + 0xc),
                   *(undefined8 *)(puVar19 + 10));
      }
      else {
        msg_5.field_2._8_8_ = 0;
        MemRangeVk_1.Handle = (VkDeviceMemory)0x0;
        MemRangeVk_1.Offset = 0;
      }
      if ((ulong)MemRangeVk_1.Handle % (ulong)pSVar12->BlockSize != 0) {
        FormatString<char[74]>
                  ((string *)local_2a0,
                   (char (*) [74])
                   "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x102d);
        std::__cxx11::string::~string((string *)local_2a0);
      }
      if (*puVar19 < pSVar12->FirstMipInTail) {
        TexHeight = 1;
        local_2ac = this_05->Width >> ((byte)*puVar19 & 0x1f);
        puVar20 = std::max<unsigned_int>(&TexHeight,&local_2ac);
        local_2a4 = *puVar20;
        TexDepth = 1;
        local_2b8 = this_05->Height >> ((byte)*puVar19 & 0x1f);
        puVar20 = std::max<unsigned_int>(&TexDepth,&local_2b8);
        local_2b0 = *puVar20;
        local_2c0 = 1;
        UVar7 = TextureDesc::GetDepth(this_05);
        vkImgMemBind._4_4_ = UVar7 >> ((byte)*puVar19 & 0x1f);
        puVar20 = std::max<unsigned_int>(&local_2c0,(uint *)((long)&vkImgMemBind + 4));
        local_2bc = *puVar20;
        local_2d0 = std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::
                    operator[]((vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                                *)&i_2,(ulong)i_1 + (ulong)local_230);
        (local_2d0->subresource).arrayLayer = puVar19[1];
        (local_2d0->subresource).aspectMask = VVar6;
        (local_2d0->subresource).mipLevel = *puVar19;
        (local_2d0->offset).x = puVar19[2];
        (local_2d0->offset).y = puVar19[4];
        (local_2d0->offset).z = puVar19[6];
        local_2d4 = Box::Width((Box *)(puVar19 + 2));
        local_2d8 = local_2a4 - puVar19[2];
        puVar20 = std::min<unsigned_int>(&local_2d4,&local_2d8);
        (local_2d0->extent).width = *puVar20;
        local_2dc = Box::Height((Box *)(puVar19 + 2));
        local_2e0 = local_2b0 - puVar19[4];
        puVar20 = std::min<unsigned_int>(&local_2dc,&local_2e0);
        (local_2d0->extent).height = *puVar20;
        vkImgOpqBind._4_4_ = Box::Depth((Box *)(puVar19 + 2));
        vkImgOpqBind._0_4_ = local_2bc - puVar19[6];
        puVar19 = std::min<unsigned_int>((uint *)((long)&vkImgOpqBind + 4),(uint *)&vkImgOpqBind);
        (local_2d0->extent).depth = *puVar19;
        local_2d0->memory = (VkDeviceMemory)msg_5.field_2._8_8_;
        local_2d0->memoryOffset = (VkDeviceSize)MemRangeVk_1.Handle;
        local_2d0->flags = 0;
        local_230 = local_230 + 1;
      }
      else {
        uVar28 = (ulong)ImageMemoryBindCount;
        ImageMemoryBindCount = ImageMemoryBindCount + 1;
        pvVar21 = std::
                  vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                  ::operator[]((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                                *)local_b8,uVar28);
        pVVar22 = TextureVkImpl::GetVkImage(pTVar11);
        pvVar21->image = pVVar22;
        pvVar21->bindCount = 1;
        pvVar15 = std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::operator[]
                            ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)
                             local_f8,(ulong)i);
        pvVar21->pBinds = pvVar15;
        UVar7 = i + 1;
        pvVar15 = std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::operator[]
                            ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)
                             local_f8,(ulong)i);
        pvVar15->resourceOffset =
             pSVar12->MipTailOffset + pSVar12->MipTailStride * (ulong)puVar19[1] +
             *(long *)(puVar19 + 8);
        pvVar15->size = *(VkDeviceSize *)(puVar19 + 10);
        pvVar15->memory = (VkDeviceMemory)msg_5.field_2._8_8_;
        pvVar15->memoryOffset = (VkDeviceSize)MemRangeVk_1.Handle;
        pvVar15->flags = 0;
        if (pvVar15->size == 0) {
          FormatString<char[46]>
                    ((string *)((long)&msg_7.field_2 + 8),
                     (char (*) [46])"Texture mip tail memory size must not be zero");
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"BindSparseResourceMemory",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1054);
          std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
        }
        bVar4 = TextureDesc::IsArray(this_05);
        i = UVar7;
        if (((bVar4) &&
            (SVar5 = Diligent::operator&(pSVar12->Flags,SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL),
            SVar5 == SPARSE_TEXTURE_FLAG_NONE)) && (pSVar12->MipTailStride == 0)) {
          FormatString<char[110]>
                    ((string *)&vkImgBind,
                     (char (*) [110])
                     "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero"
                    );
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"BindSparseResourceMemory",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1056);
          std::__cxx11::string::~string((string *)&vkImgBind);
        }
      }
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)((long)&msg_4.field_2 + 8));
    }
    if (local_230 != 0) {
      uVar28 = (ulong)MemoryBindCount;
      MemoryBindCount = MemoryBindCount + 1;
      pvVar23 = std::
                vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::
                operator[]((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                            *)local_d8,uVar28);
      pVVar22 = TextureVkImpl::GetVkImage(pTVar11);
      pvVar23->image = pVVar22;
      pvVar23->bindCount = local_230;
      pvVar24 = std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::
                operator[]((vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            *)&i_2,(ulong)i_1);
      pvVar23->pBinds = pvVar24;
      i_1 = local_230 + i_1;
    }
  }
  Args_1 = (char (*) [40])
           std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::size
                     ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)local_f8);
  if ((char (*) [40])(ulong)i != Args_1) {
    FormatString<char[26],char[40]>
              ((string *)((long)&msg_9.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryBindCount == vkMemoryBinds.size()",Args_1);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1065);
    std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
  }
  Args_1_00 = (char (*) [50])
              std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::size
                        ((vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                          *)&i_2);
  if ((char (*) [50])(ulong)i_1 != Args_1_00) {
    FormatString<char[26],char[50]>
              ((string *)((long)&msg_10.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageMemoryBindCount == vkImageMemoryBinds.size()",Args_1_00);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1066);
    std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
  }
  Args_1_01 = (char (*) [38])
              std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
              ::size((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                      *)local_d8);
  if ((char (*) [38])(ulong)MemoryBindCount != Args_1_01) {
    FormatString<char[26],char[38]>
              ((string *)((long)&msg_11.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageBindCount == vkImageBinds.size()",Args_1_01);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1067);
    std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
  }
  Args_1_02 = (char (*) [64])
              std::
              vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
              ::size((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                      *)local_b8);
  if ((char (*) [64])(ulong)ImageMemoryBindCount != Args_1_02) {
    FormatString<char[26],char[47]>
              ((string *)local_3c0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageOpqBindCount == vkImageOpaqueBinds.size()",
               (char (*) [47])Args_1_02);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Args_1_02 = (char (*) [64])0x1068;
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1068);
    std::__cxx11::string::~string((string *)local_3c0);
  }
  BindSparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
  BindSparse.signalSemaphoreCount = 0;
  BindSparse._84_4_ = 0;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  BindSparse.imageBindCount = 0;
  BindSparse._68_4_ = 0;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  BindSparse.imageOpaqueBindCount = 0;
  BindSparse._52_4_ = 0;
  BindSparse.pWaitSemaphores = (VkSemaphore *)0x0;
  BindSparse.bufferBindCount = 0;
  BindSparse._36_4_ = 0;
  BindSparse.pNext = (void *)0x0;
  BindSparse.waitSemaphoreCount = 0;
  BindSparse._20_4_ = 0;
  BindSparse.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  BindSparse._4_4_ = 0;
  auStack_428 = (undefined1  [8])0x7;
  local_430 = (__buckets_ptr)
              std::
              vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::
              size((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                    *)local_98);
  uVar8 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_430);
  BindSparse.pWaitSemaphores = (VkSemaphore *)CONCAT44(BindSparse.pWaitSemaphores._4_4_,uVar8);
  bVar4 = std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::
          empty((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                 *)local_98);
  if (bVar4) {
    local_700 = (VkSparseBufferMemoryBindInfo *)0x0;
  }
  else {
    local_700 = std::
                vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                ::data((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                        *)local_98);
  }
  BindSparse._32_8_ = local_700;
  local_438 = std::
              vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
              ::size((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                      *)local_b8);
  uVar8 = StaticCast<unsigned_int,unsigned_long>(&local_438);
  BindSparse.pBufferBinds =
       (VkSparseBufferMemoryBindInfo *)CONCAT44(BindSparse.pBufferBinds._4_4_,uVar8);
  bVar4 = std::
          vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
          ::empty((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                   *)local_b8);
  if (bVar4) {
    local_710 = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  }
  else {
    local_710 = std::
                vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                ::data((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                        *)local_b8);
  }
  BindSparse._48_8_ = local_710;
  msg_12.field_2._8_8_ =
       std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::size
                 ((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                   *)local_d8);
  uVar8 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)(msg_12.field_2._M_local_buf + 8))
  ;
  BindSparse.pImageOpaqueBinds =
       (VkSparseImageOpaqueMemoryBindInfo *)CONCAT44(BindSparse.pImageOpaqueBinds._4_4_,uVar8);
  bVar4 = std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::
          empty((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> *
                )local_d8);
  if (bVar4) {
    local_720 = (VkSparseImageMemoryBindInfo *)0x0;
  }
  else {
    local_720 = std::
                vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::
                data((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                      *)local_d8);
  }
  BindSparse._64_8_ = local_720;
  bVar4 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::empty
                    (&this->m_VkSignalSemaphores);
  if ((!bVar4) ||
     (bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (&this->m_SignalSemaphoreValues), !bVar4)) {
    FormatString<char[26],char[64]>
              ((string *)((long)&msg_13.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty()",
               Args_1_02);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Args_1_02 = (char (*) [64])0x1073;
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1073);
    std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
  }
  bVar4 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::empty
                    (&this->m_VkWaitSemaphores);
  if ((!bVar4) ||
     (bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (&this->m_WaitSemaphoreValues), !bVar4)) {
    FormatString<char[26],char[60]>
              ((string *)&i_4,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty()",
               (char (*) [60])Args_1_02);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1074);
    std::__cxx11::string::~string((string *)&i_4);
  }
  pFenceVk._7_1_ = 0;
  for (pFenceVk._0_4_ = 0; (uint)pFenceVk < *(uint *)(msg.field_2._8_8_ + 0x48);
      pFenceVk._0_4_ = (uint)pFenceVk + 1) {
    SignalValue = (Uint64)ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>
                                    (*(IFence **)
                                      (*(long *)(msg.field_2._8_8_ + 0x38) +
                                      (ulong)(uint)pFenceVk * 8));
    local_498 = *(Char **)(*(long *)(msg.field_2._8_8_ + 0x40) + (ulong)(uint)pFenceVk * 8);
    bVar4 = FenceVkImpl::IsTimelineSemaphore((FenceVkImpl *)SignalValue);
    if (bVar4) {
      pFenceVk._7_1_ = 1;
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                ((FenceBase<Diligent::EngineVkImplTraits> *)SignalValue,(Uint64)local_498);
      pVStack_4a0 = FenceVkImpl::GetVkSemaphore((FenceVkImpl *)SignalValue);
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkSignalSemaphores,&stack0xfffffffffffffb60);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_SignalSemaphoreValues,(value_type_conflict2 *)&local_498);
    }
  }
  for (pFenceVk_1._4_4_ = 0; pFenceVk_1._4_4_ < *(uint *)(msg.field_2._8_8_ + 0x30);
      pFenceVk_1._4_4_ = pFenceVk_1._4_4_ + 1) {
    WaitValue = (Uint64)ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>
                                  (*(IFence **)
                                    (*(long *)(msg.field_2._8_8_ + 0x20) +
                                    (ulong)pFenceVk_1._4_4_ * 8));
    WaitSem = *(VkSemaphore *)(*(long *)(msg.field_2._8_8_ + 0x28) + (ulong)pFenceVk_1._4_4_ * 8);
    FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
              ((FenceBase<Diligent::EngineVkImplTraits> *)WaitValue,(Uint64)WaitSem);
    bVar4 = FenceVkImpl::IsTimelineSemaphore((FenceVkImpl *)WaitValue);
    UVar30 = WaitValue;
    if (bVar4) {
      pFenceVk._7_1_ = 1;
      j_1 = (size_t)FenceVkImpl::GetVkSemaphore((FenceVkImpl *)WaitValue);
      for (_msg.field_2._8_8_ = 0;
          sVar25 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                             (&this->m_VkWaitSemaphores), (ulong)_msg.field_2._8_8_ < sVar25;
          _msg.field_2._8_8_ = _msg.field_2._8_8_ + 1) {
        ppVVar26 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::operator[]
                             (&this->m_VkWaitSemaphores,_msg.field_2._8_8_);
        if (*ppVVar26 == (value_type)j_1) {
          Args = DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                            *)WaitValue);
          Args_4 = (char (*) [54])
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_WaitSemaphoreValues,_msg.field_2._8_8_);
          FormatString<char[8],char_const*,char[15],unsigned_long,char[54],unsigned_long,char[2]>
                    ((string *)&WaitSem_1.m_IsUnsignaled,(Diligent *)"Fence \'",(char (*) [8])Args,
                     (char **)"\' with value (",(char (*) [15])&WaitSem,
                     (unsigned_long *)") is already added to the wait operation with value (",Args_4
                     ,(unsigned_long *)0xcabce5,in_stack_fffffffffffff7f8);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar27 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar27,0);
          }
          std::__cxx11::string::~string((string *)&WaitSem_1.m_IsUnsignaled);
        }
      }
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkWaitSemaphores,(value_type *)&j_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_WaitSemaphoreValues,(value_type_conflict2 *)&WaitSem);
    }
    else {
      local_509 = (uchar)DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                                   (&this->
                                     super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      FenceVkImpl::ExtractSignalSemaphore
                ((VulkanRecycledSemaphore *)local_508,(FenceVkImpl *)UVar30,
                 (SoftwareQueueIndex)local_509,(Uint64)WaitSem);
      bVar4 = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::operator_cast_to_bool
                        ((RecycledSyncObject *)local_508);
      if (bVar4) {
        local_518 = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::
                    operator_cast_to_VkSemaphore_T_((RecycledSyncObject *)local_508);
        std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                  (&this->m_VkWaitSemaphores,&local_518);
        local_51c = 0x10000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_WaitDstStageMasks,&local_51c);
        std::
        vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
        ::push_back(&this->m_WaitRecycledSemaphores,(value_type *)local_508);
        local_528 = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->m_WaitSemaphoreValues,(value_type_conflict2 *)&local_528);
      }
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_508);
    }
  }
  local_530 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                        (&this->m_VkWaitSemaphores);
  uVar8 = StaticCast<unsigned_int,unsigned_long>(&local_530);
  BindSparse.pNext = (void *)CONCAT44(BindSparse.pNext._4_4_,uVar8);
  if (uVar8 == 0) {
    local_7a8 = (VkSemaphore_T **)0x0;
  }
  else {
    local_7a8 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::data
                          (&this->m_VkWaitSemaphores);
  }
  BindSparse._16_8_ = local_7a8;
  TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues =
       (uint64_t *)
       std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                 (&this->m_VkSignalSemaphores);
  uVar8 = StaticCast<unsigned_int,unsigned_long>
                    ((unsigned_long *)&TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues);
  BindSparse.pImageBinds =
       (VkSparseImageMemoryBindInfo *)CONCAT44(BindSparse.pImageBinds._4_4_,uVar8);
  if (uVar8 == 0) {
    local_7b8 = (VkSemaphore_T **)0x0;
  }
  else {
    local_7b8 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::data
                          (&this->m_VkSignalSemaphores);
  }
  BindSparse._80_8_ = local_7b8;
  memset(&pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount,0,0x30);
  if ((pFenceVk._7_1_ & 1) != 0) {
    BindSparse._0_8_ =
         &pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0x3b9df29b;
    TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    TimelineSemaphoreSubmitInfo._4_4_ = 0;
    TimelineSemaphoreSubmitInfo.pNext._0_4_ = (int)BindSparse.pNext;
    if ((int)BindSparse.pNext == 0) {
      local_7c0 = (unsigned_long *)0x0;
    }
    else {
      local_7c0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            (&this->m_WaitSemaphoreValues);
    }
    TimelineSemaphoreSubmitInfo._16_8_ = local_7c0;
    TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues._0_4_ = (int)BindSparse.pImageBinds;
    if ((int)BindSparse.pImageBinds == 0) {
      local_7c8 = (unsigned_long *)0x0;
    }
    else {
      local_7c8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            (&this->m_SignalSemaphoreValues);
    }
    TimelineSemaphoreSubmitInfo._32_8_ = local_7c8;
  }
  std::shared_ptr<Diligent::SyncPointVk>::shared_ptr((shared_ptr<Diligent::SyncPointVk> *)&pQueueVk)
  ;
  Ptr = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::LockCommandQueue
                  (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  local_580 = (element_type *)
              ClassPtrCast<Diligent::CommandQueueVkImpl,Diligent::ICommandQueueVk>(Ptr);
  CommandQueueVkImpl::BindSparse((CommandQueueVkImpl *)local_580,(VkBindSparseInfo *)auStack_428);
  CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)local_590);
  std::shared_ptr<Diligent::SyncPointVk>::operator=
            ((shared_ptr<Diligent::SyncPointVk> *)&pQueueVk,
             (shared_ptr<Diligent::SyncPointVk> *)local_590);
  std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr
            ((shared_ptr<Diligent::SyncPointVk> *)local_590);
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UnlockCommandQueue
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if ((pFenceVk._7_1_ & 1) == 0) {
    for (pFenceVk_2._4_4_ = 0; pFenceVk_2._4_4_ < *(uint *)(msg.field_2._8_8_ + 0x48);
        pFenceVk_2._4_4_ = pFenceVk_2._4_4_ + 1) {
      local_5a0 = ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>
                            (*(IFence **)
                              (*(long *)(msg.field_2._8_8_ + 0x38) + (ulong)pFenceVk_2._4_4_ * 8));
      bVar4 = FenceVkImpl::IsTimelineSemaphore(local_5a0);
      this_04 = local_5a0;
      if (!bVar4) {
        local_5a1 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                              (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        UVar30 = *(Uint64 *)(*(long *)(msg.field_2._8_8_ + 0x40) + (ulong)pFenceVk_2._4_4_ * 8);
        std::shared_ptr<Diligent::SyncPointVk>::shared_ptr
                  (&local_5b8,(shared_ptr<Diligent::SyncPointVk> *)&pQueueVk);
        FenceVkImpl::AddPendingSyncPoint(this_04,local_5a1,UVar30,&local_5b8);
        std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr(&local_5b8);
      }
    }
  }
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear(&this->m_VkSignalSemaphores)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_SignalSemaphoreValues);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear(&this->m_VkWaitSemaphores);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_WaitSemaphoreValues);
  std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr
            ((shared_ptr<Diligent::SyncPointVk> *)&pQueueVk);
  std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::~vector
            ((vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> *)&i_2);
  std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::~vector
            ((vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> *)local_f8);
  std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::~vector
            ((vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> *)
             local_d8);
  std::vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::~vector((vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             *)local_b8);
  std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::~vector
            ((vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> *)
             local_98);
  return;
}

Assistant:

void DeviceContextVkImpl::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs)
{
    TDeviceContextBase::BindSparseResourceMemory(Attribs, 0);

    VERIFY_EXPR(Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0);

    Flush();

    // Calculate the required array sizes
    Uint32 ImageBindCount       = 0;
    Uint32 ImageOpqBindCount    = 0;
    Uint32 MemoryBindCount      = 0;
    Uint32 ImageMemoryBindCount = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
        MemoryBindCount += Attribs.pBufferBinds[i].NumRanges;

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind           = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(Bind.pTexture);
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 j = 0; j < Bind.NumRanges; ++j)
        {
            if (Bind.pRanges[j].MipLevel >= TexSparseProps.FirstMipInTail)
            {
                ++MemoryBindCount;
                ++ImageOpqBindCount;
            }
            else
            {
                ++NumImageBindsInRange;
                ++ImageMemoryBindCount;
            }
        }
        if (NumImageBindsInRange > 0)
            ++ImageBindCount;
    }

    std::vector<VkSparseBufferMemoryBindInfo>      vkBufferBinds{Attribs.NumBufferBinds};
    std::vector<VkSparseImageOpaqueMemoryBindInfo> vkImageOpaqueBinds{ImageOpqBindCount};
    std::vector<VkSparseImageMemoryBindInfo>       vkImageBinds{ImageBindCount};
    std::vector<VkSparseMemoryBind>                vkMemoryBinds{MemoryBindCount};
    std::vector<VkSparseImageMemoryBind>           vkImageMemoryBinds{ImageMemoryBindCount};

    MemoryBindCount      = 0;
    ImageMemoryBindCount = 0;
    ImageBindCount       = 0;
    ImageOpqBindCount    = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& BuffBind = Attribs.pBufferBinds[i];
        const BufferVkImpl*               pBuffVk  = ClassPtrCast<const BufferVkImpl>(BuffBind.pBuffer);
#ifdef DILIGENT_DEVELOPMENT
        const SparseBufferProperties& BuffSparseProps = pBuffVk->GetSparseProperties();
#endif

        VkSparseBufferMemoryBindInfo& vkBuffBind{vkBufferBinds[i]};
        vkBuffBind.buffer    = pBuffVk->GetVkBuffer();
        vkBuffBind.bindCount = BuffBind.NumRanges;
        vkBuffBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

        for (Uint32 r = 0; r < BuffBind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& SrcRange = BuffBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>     pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const DeviceMemoryRangeVk MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR(MemRangeVk.Offset % BuffSparseProps.BlockSize == 0,
                          "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");

            VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
            vkMemBind.resourceOffset = SrcRange.BufferOffset;
            vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero when range is unbound
            vkMemBind.memory         = MemRangeVk.Handle;
            vkMemBind.memoryOffset   = MemRangeVk.Offset;
            vkMemBind.flags          = 0;

            VERIFY(vkMemBind.size > 0, "Buffer memory size must not be zero");
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& TexBind        = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(TexBind.pTexture);
        const TextureDesc&                 TexDesc        = pTexVk->GetDesc();
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();
        const TextureFormatAttribs&        FmtAttribs     = GetTextureFormatAttribs(TexDesc.Format);
        const VkImageAspectFlags           aspectMask     = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 r = 0; r < TexBind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& SrcRange = TexBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>      pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const auto MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR((MemRangeVk.Offset % TexSparseProps.BlockSize) == 0,
                          "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");

            if (SrcRange.MipLevel < TexSparseProps.FirstMipInTail)
            {
                const Uint32 TexWidth  = std::max(1u, TexDesc.Width >> SrcRange.MipLevel);
                const Uint32 TexHeight = std::max(1u, TexDesc.Height >> SrcRange.MipLevel);
                const Uint32 TexDepth  = std::max(1u, TexDesc.GetDepth() >> SrcRange.MipLevel);

                VkSparseImageMemoryBind& vkImgMemBind{vkImageMemoryBinds[size_t{ImageMemoryBindCount} + size_t{NumImageBindsInRange}]};
                vkImgMemBind.subresource.arrayLayer = SrcRange.ArraySlice;
                vkImgMemBind.subresource.aspectMask = aspectMask;
                vkImgMemBind.subresource.mipLevel   = SrcRange.MipLevel;
                vkImgMemBind.offset.x               = static_cast<int32_t>(SrcRange.Region.MinX);
                vkImgMemBind.offset.y               = static_cast<int32_t>(SrcRange.Region.MinY);
                vkImgMemBind.offset.z               = static_cast<int32_t>(SrcRange.Region.MinZ);
                vkImgMemBind.extent.width           = static_cast<int32_t>(std::min(SrcRange.Region.Width(), TexWidth - SrcRange.Region.MinX));
                vkImgMemBind.extent.height          = static_cast<int32_t>(std::min(SrcRange.Region.Height(), TexHeight - SrcRange.Region.MinY));
                vkImgMemBind.extent.depth           = static_cast<int32_t>(std::min(SrcRange.Region.Depth(), TexDepth - SrcRange.Region.MinZ));
                vkImgMemBind.memory                 = MemRangeVk.Handle;
                vkImgMemBind.memoryOffset           = MemRangeVk.Offset;
                vkImgMemBind.flags                  = 0;

                ++NumImageBindsInRange;
            }
            else
            {
                // Bind mip tail memory
                VkSparseImageOpaqueMemoryBindInfo& vkImgOpqBind{vkImageOpaqueBinds[ImageOpqBindCount++]};
                vkImgOpqBind.image     = pTexVk->GetVkImage();
                vkImgOpqBind.bindCount = 1;
                vkImgOpqBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

                VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
                vkMemBind.resourceOffset = TexSparseProps.MipTailOffset + TexSparseProps.MipTailStride * SrcRange.ArraySlice + SrcRange.OffsetInMipTail;
                vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero if tail is unbound
                vkMemBind.memory         = MemRangeVk.Handle;
                vkMemBind.memoryOffset   = MemRangeVk.Offset;
                vkMemBind.flags          = 0;

                VERIFY(vkMemBind.size > 0, "Texture mip tail memory size must not be zero");
                VERIFY(!(TexDesc.IsArray() && (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == 0) || TexSparseProps.MipTailStride != 0,
                       "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero");
            }
        }

        if (NumImageBindsInRange > 0)
        {
            VkSparseImageMemoryBindInfo& vkImgBind{vkImageBinds[ImageBindCount++]};
            vkImgBind.image     = pTexVk->GetVkImage();
            vkImgBind.bindCount = NumImageBindsInRange;
            vkImgBind.pBinds    = &vkImageMemoryBinds[ImageMemoryBindCount];

            ImageMemoryBindCount += NumImageBindsInRange;
        }
    }

    VERIFY_EXPR(MemoryBindCount == vkMemoryBinds.size());
    VERIFY_EXPR(ImageMemoryBindCount == vkImageMemoryBinds.size());
    VERIFY_EXPR(ImageBindCount == vkImageBinds.size());
    VERIFY_EXPR(ImageOpqBindCount == vkImageOpaqueBinds.size());

    VkBindSparseInfo BindSparse{};
    BindSparse.sType                = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
    BindSparse.bufferBindCount      = StaticCast<uint32_t>(vkBufferBinds.size());
    BindSparse.pBufferBinds         = !vkBufferBinds.empty() ? vkBufferBinds.data() : nullptr;
    BindSparse.imageOpaqueBindCount = StaticCast<uint32_t>(vkImageOpaqueBinds.size());
    BindSparse.pImageOpaqueBinds    = !vkImageOpaqueBinds.empty() ? vkImageOpaqueBinds.data() : nullptr;
    BindSparse.imageBindCount       = StaticCast<uint32_t>(vkImageBinds.size());
    BindSparse.pImageBinds          = !vkImageBinds.empty() ? vkImageBinds.data() : nullptr;

    VERIFY_EXPR(m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty());
    VERIFY_EXPR(m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty());

    bool UsedTimelineSemaphore = false;
    for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
    {
        FenceVkImpl* pFenceVk    = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
        Uint64       SignalValue = Attribs.pSignalFenceValues[i];
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(SignalValue);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(SignalValue);
    }

    for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
    {
        FenceVkImpl* pFenceVk  = ClassPtrCast<FenceVkImpl>(Attribs.ppWaitFences[i]);
        Uint64       WaitValue = Attribs.pWaitFenceValues[i];
        pFenceVk->DvpDeviceWait(WaitValue);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t j = 0; j < m_VkWaitSemaphores.size(); ++j)
            {
                if (m_VkWaitSemaphores[j] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", WaitValue,
                                      ") is already added to the wait operation with value (", m_WaitSemaphoreValues[j], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitSemaphoreValues.push_back(WaitValue);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), WaitValue))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }
    BindSparse.waitSemaphoreCount   = StaticCast<uint32_t>(m_VkWaitSemaphores.size());
    BindSparse.pWaitSemaphores      = BindSparse.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    BindSparse.signalSemaphoreCount = StaticCast<uint32_t>(m_VkSignalSemaphores.size());
    BindSparse.pSignalSemaphores    = BindSparse.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        BindSparse.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = BindSparse.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = BindSparse.waitSemaphoreCount != 0 ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = BindSparse.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = BindSparse.signalSemaphoreCount != 0 ? m_SignalSemaphoreValues.data() : nullptr;
    }

    SyncPointVkPtr pSyncPoint;
    {
        CommandQueueVkImpl* pQueueVk = ClassPtrCast<CommandQueueVkImpl>(LockCommandQueue());

        pQueueVk->BindSparse(BindSparse);
        pSyncPoint = pQueueVk->GetLastSyncPoint();

        UnlockCommandQueue();
    }

    if (!UsedTimelineSemaphore)
    {
        for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
        {
            FenceVkImpl* pFenceVk = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
            if (!pFenceVk->IsTimelineSemaphore())
                pFenceVk->AddPendingSyncPoint(GetCommandQueueId(), Attribs.pSignalFenceValues[i], pSyncPoint);
        }
    }

    m_VkSignalSemaphores.clear();
    m_SignalSemaphoreValues.clear();
    m_VkWaitSemaphores.clear();
    m_WaitSemaphoreValues.clear();
}